

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList>::
emplaceRealloc<slang::syntax::TransRangeSyntax&,slang::ast::Type_const&,slang::ast::ASTContext&>
          (SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList> *this,pointer pos,
          TransRangeSyntax *args,Type *args_1,ASTContext *args_2)

{
  TransRangeList *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  size_type sVar4;
  pointer ppEVar5;
  size_t sVar6;
  Expression *pEVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  pointer pTVar11;
  pointer pTVar12;
  undefined4 uVar13;
  pointer pTVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  uVar16 = this->len + 1;
  uVar3 = this->cap;
  if (uVar16 < uVar3 * 2) {
    uVar16 = uVar3 * 2;
  }
  if (0x333333333333333 - uVar3 < uVar3) {
    uVar16 = 0x333333333333333;
  }
  lVar17 = (long)pos - (long)this->data_;
  pTVar14 = (pointer)operator_new(uVar16 * 0x28);
  this_00 = (TransRangeList *)((long)pTVar14 + lVar17);
  ast::CoverageBinSymbol::TransRangeList::TransRangeList(this_00,args,args_1,args_2);
  p = this->data_;
  sVar4 = this->len;
  lVar15 = (long)p + (sVar4 * 0x28 - (long)pos);
  pTVar11 = p;
  pTVar12 = pTVar14;
  if (lVar15 == 0) {
    if (sVar4 != 0) {
      lVar15 = 0;
      do {
        *(undefined8 *)((long)&pTVar14->repeatKind + lVar15) =
             *(undefined8 *)((long)&p->repeatKind + lVar15);
        puVar1 = (undefined8 *)((long)&(p->items)._M_ptr + lVar15);
        uVar8 = *puVar1;
        uVar9 = puVar1[1];
        puVar1 = (undefined8 *)((long)&p->repeatFrom + lVar15);
        uVar10 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pTVar14->repeatFrom + lVar15);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        puVar1 = (undefined8 *)((long)&(pTVar14->items)._M_ptr + lVar15);
        *puVar1 = uVar8;
        puVar1[1] = uVar9;
        lVar15 = lVar15 + 0x28;
      } while (sVar4 * 0x28 != lVar15);
    }
  }
  else {
    for (; pTVar11 != pos; pTVar11 = pTVar11 + 1) {
      uVar13 = *(undefined4 *)&pTVar11->field_0x24;
      pTVar12->repeatKind = pTVar11->repeatKind;
      *(undefined4 *)&pTVar12->field_0x24 = uVar13;
      ppEVar5 = (pTVar11->items)._M_ptr;
      sVar6 = (pTVar11->items)._M_extent._M_extent_value;
      pEVar7 = pTVar11->repeatTo;
      pTVar12->repeatFrom = pTVar11->repeatFrom;
      pTVar12->repeatTo = pEVar7;
      (pTVar12->items)._M_ptr = ppEVar5;
      (pTVar12->items)._M_extent._M_extent_value = sVar6;
      pTVar12 = pTVar12 + 1;
    }
    memcpy((void *)((long)pTVar14 + lVar17 + 0x28),pos,((lVar15 - 0x28U) / 0x28) * 0x28 + 0x28);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar16;
  this->data_ = pTVar14;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}